

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

void __thiscall QTableViewPrivate::selectColumn(QTableViewPrivate *this,int column,bool anchor)

{
  QAbstractItemModel *pQVar1;
  QRect QVar2;
  byte bVar3;
  bool bVar4;
  SelectionBehavior SVar5;
  SelectionMode SVar6;
  int iVar7;
  int iVar8;
  QFlags<QItemSelectionModel::SelectionFlag> QVar9;
  QTableView *pQVar10;
  QItemSelectionModel *pQVar11;
  int *piVar12;
  SelectionFlag SVar13;
  byte in_DL;
  int in_ESI;
  QTableViewPrivate *in_RDI;
  long in_FS_OFFSET;
  bool bVar14;
  int row;
  QTableView *q;
  QModelIndex right;
  QModelIndex left;
  int columnSectionAnchor;
  QPersistentModelIndex startIndex;
  SelectionFlags command;
  QModelIndex index;
  undefined4 in_stack_fffffffffffffde8;
  SelectionFlag in_stack_fffffffffffffdec;
  QListSpecialMethodsBase<QModelIndex> *in_stack_fffffffffffffdf0;
  QHeaderView *in_stack_fffffffffffffdf8;
  QTableView *pQVar15;
  QItemSelection local_168;
  undefined1 local_150 [16];
  QRect local_140;
  undefined1 local_130 [16];
  QPersistentModelIndex local_120 [3];
  QModelIndex local_108;
  QPersistentModelIndex local_f0 [3];
  QModelIndex local_d8;
  int local_bc;
  undefined1 local_b8 [24];
  QPersistentModelIndex local_a0 [3];
  undefined1 local_88 [24];
  QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4> local_70;
  undefined4 local_6c;
  QPersistentModelIndex local_68;
  QFlagsStorage<QItemSelectionModel::SelectionFlag> local_5c;
  QPersistentModelIndex local_58 [3];
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  QPersistentModelIndex local_28 [3];
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = in_DL & 1;
  local_c = in_ESI;
  pQVar10 = q_func(in_RDI);
  SVar5 = QAbstractItemView::selectionBehavior((QAbstractItemView *)in_stack_fffffffffffffdf0);
  QVar2.x2.m_i = local_140.x2.m_i;
  QVar2.y2.m_i = local_140.y2.m_i;
  QVar2.x1.m_i = local_140.x1.m_i;
  QVar2.y1.m_i = local_140.y1.m_i;
  if (SVar5 == SelectRows) goto LAB_008c0fcb;
  SVar6 = QAbstractItemView::selectionMode((QAbstractItemView *)in_stack_fffffffffffffdf0);
  if (SVar6 == SingleSelection) {
    SVar5 = QAbstractItemView::selectionBehavior((QAbstractItemView *)in_stack_fffffffffffffdf0);
    QVar2.x2.m_i = local_140.x2.m_i;
    QVar2.y2.m_i = local_140.y2.m_i;
    QVar2.x1.m_i = local_140.x1.m_i;
    QVar2.y1.m_i = local_140.y1.m_i;
    if (SVar5 == SelectItems) goto LAB_008c0fcb;
  }
  iVar8 = local_c;
  bVar14 = false;
  if (-1 < local_c) {
    pQVar1 = (in_RDI->super_QAbstractItemViewPrivate).model;
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_28);
    iVar7 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,local_28);
    bVar14 = iVar8 < iVar7;
  }
  QVar2.x2.m_i = local_140.x2.m_i;
  QVar2.y2.m_i = local_140.y2.m_i;
  QVar2.x1.m_i = local_140.x1.m_i;
  QVar2.y1.m_i = local_140.y1.m_i;
  if (!bVar14) goto LAB_008c0fcb;
  iVar7 = QHeaderView::logicalIndexAt
                    (in_stack_fffffffffffffdf8,(int)((ulong)in_stack_fffffffffffffdf0 >> 0x20));
  iVar8 = local_c;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = (in_RDI->super_QAbstractItemViewPrivate).model;
  QPersistentModelIndex::operator_cast_to_QModelIndex(local_58);
  (**(code **)(*(long *)pQVar1 + 0x60))(&local_40,pQVar1,iVar7,iVar8,local_58);
  local_5c.i = 0xaaaaaaaa;
  local_5c.i = (**(code **)(*(long *)&(pQVar10->super_QAbstractItemView).super_QAbstractScrollArea.
                                      super_QFrame.super_QWidget + 0x2e8))(pQVar10,&local_40,0);
  local_68.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
  QPersistentModelIndex::QPersistentModelIndex
            (&local_68,&(in_RDI->super_QAbstractItemViewPrivate).currentSelectionStartIndex);
  pQVar11 = QPointer<QItemSelectionModel>::operator->((QPointer<QItemSelectionModel> *)0x8c0abe);
  QFlags<QItemSelectionModel::SelectionFlag>::QFlags
            ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_fffffffffffffdf0,
             in_stack_fffffffffffffdec);
  (**(code **)(*(long *)pQVar11 + 0x60))(pQVar11,&local_40,local_6c);
  QPersistentModelIndex::operator=
            (&(in_RDI->super_QAbstractItemViewPrivate).currentSelectionStartIndex,&local_68);
  QPersistentModelIndex::~QPersistentModelIndex(&local_68);
  if (bVar3 == 0) {
LAB_008c0b52:
    SVar6 = QAbstractItemView::selectionMode((QAbstractItemView *)in_stack_fffffffffffffdf0);
    bVar14 = SVar6 == SingleSelection;
  }
  else {
    local_70.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i =
         (QFlagsStorage<QItemSelectionModel::SelectionFlag>)
         QFlags<QItemSelectionModel::SelectionFlag>::operator&
                   ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_fffffffffffffdf0,
                    in_stack_fffffffffffffdec);
    bVar4 = QFlags<QItemSelectionModel::SelectionFlag>::operator!
                      ((QFlags<QItemSelectionModel::SelectionFlag> *)&local_70);
    bVar14 = true;
    if (!bVar4) goto LAB_008c0b52;
  }
  if (bVar14) {
    pQVar1 = (in_RDI->super_QAbstractItemViewPrivate).model;
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_a0);
    (**(code **)(*(long *)pQVar1 + 0x60))(local_88,pQVar1,iVar7,local_c,local_a0);
    QPersistentModelIndex::operator=
              (&(in_RDI->super_QAbstractItemViewPrivate).currentSelectionStartIndex,
               (QModelIndex *)local_88);
  }
  SVar6 = QAbstractItemView::selectionMode((QAbstractItemView *)in_stack_fffffffffffffdf0);
  if ((SVar6 != SingleSelection) &&
     (bVar14 = QFlags<QItemSelectionModel::SelectionFlag>::testFlag
                         ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_fffffffffffffdf0,
                          in_stack_fffffffffffffdec), bVar14)) {
    if (bVar3 != 0) {
      QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_fffffffffffffdf0);
      QItemSelectionModel::selectedColumns((int)local_b8);
      bVar14 = QListSpecialMethodsBase<QModelIndex>::contains<QModelIndex>
                         (in_stack_fffffffffffffdf0,
                          (QModelIndex *)
                          CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
      SVar13 = Select;
      if (bVar14) {
        SVar13 = Deselect;
      }
      (in_RDI->super_QAbstractItemViewPrivate).ctrlDragSelectionFlag = SVar13;
      QList<QModelIndex>::~QList((QList<QModelIndex> *)0x8c0c9a);
    }
    QFlags<QItemSelectionModel::SelectionFlag>::operator&=
              ((QFlags<QItemSelectionModel::SelectionFlag> *)&local_5c,-9);
    QFlags<QItemSelectionModel::SelectionFlag>::operator|=
              ((QFlags<QItemSelectionModel::SelectionFlag> *)&local_5c,
               (in_RDI->super_QAbstractItemViewPrivate).ctrlDragSelectionFlag);
    if (bVar3 == 0) {
      QFlags<QItemSelectionModel::SelectionFlag>::operator|=
                ((QFlags<QItemSelectionModel::SelectionFlag> *)&local_5c,Current);
    }
  }
  local_bc = QPersistentModelIndex::column();
  local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_d8.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = (in_RDI->super_QAbstractItemViewPrivate).model;
  piVar12 = qMin<int>(&local_bc,&local_c);
  iVar8 = *piVar12;
  QPersistentModelIndex::operator_cast_to_QModelIndex(local_f0);
  (**(code **)(*(long *)pQVar1 + 0x60))(&local_d8,pQVar1,iVar7,iVar8,local_f0);
  local_108._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_108.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  local_108.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = (in_RDI->super_QAbstractItemViewPrivate).model;
  piVar12 = qMax<int>(&local_bc,&local_c);
  iVar8 = *piVar12;
  QPersistentModelIndex::operator_cast_to_QModelIndex(local_120);
  (**(code **)(*(long *)pQVar1 + 0x60))(&local_108,pQVar1,iVar7,iVar8,local_120);
  bVar14 = QHeaderView::sectionsMoved((QHeaderView *)in_stack_fffffffffffffdf0);
  if (bVar14) {
    iVar8 = QModelIndex::column(&local_d8);
    iVar7 = QModelIndex::column(&local_108);
    if (iVar8 != iVar7) {
      pQVar15 = pQVar10;
      local_140 = (QRect)(**(code **)(*(long *)&(pQVar10->super_QAbstractItemView).
                                                super_QAbstractScrollArea.super_QFrame.super_QWidget
                                     + 0x1e0))(pQVar10,&local_d8);
      local_150 = (**(code **)(*(long *)&(pQVar10->super_QAbstractItemView).
                                         super_QAbstractScrollArea.super_QFrame.super_QWidget +
                              0x1e0))(pQVar10,&local_108);
      local_130 = QRect::operator|(&local_140,(QRect *)local_150);
      QVar9 = QFlags<QItemSelectionModel::SelectionFlag>::operator|
                        ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_fffffffffffffdf0,
                         in_stack_fffffffffffffdec);
      (**(code **)(*(long *)&(pQVar15->super_QAbstractItemView).super_QAbstractScrollArea.
                             super_QFrame.super_QWidget + 0x2c8))
                (pQVar15,local_130,
                 QVar9.super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
                 super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i);
      QVar2 = local_140;
      goto LAB_008c0fcb;
    }
  }
  pQVar11 = QPointer<QItemSelectionModel>::operator->((QPointer<QItemSelectionModel> *)0x8c0f67);
  QItemSelection::QItemSelection(&local_168,(QModelIndex *)&local_d8,(QModelIndex *)&local_108);
  QVar9 = QFlags<QItemSelectionModel::SelectionFlag>::operator|
                    ((QFlags<QItemSelectionModel::SelectionFlag> *)pQVar11,in_stack_fffffffffffffdec
                    );
  (**(code **)(*(long *)pQVar11 + 0x70))
            (pQVar11,&local_168,
             QVar9.super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
             super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i);
  QItemSelection::~QItemSelection((QItemSelection *)0x8c0fc9);
  QVar2.x2.m_i = local_140.x2.m_i;
  QVar2.y2.m_i = local_140.y2.m_i;
  QVar2.x1.m_i = local_140.x1.m_i;
  QVar2.y1.m_i = local_140.y1.m_i;
LAB_008c0fcb:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    local_140 = QVar2;
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTableViewPrivate::selectColumn(int column, bool anchor)
{
    Q_Q(QTableView);

    if (q->selectionBehavior() == QTableView::SelectRows
        || (q->selectionMode() == QTableView::SingleSelection
            && q->selectionBehavior() == QTableView::SelectItems))
        return;

    if (column >= 0 && column < model->columnCount(root)) {
        int row = verticalHeader->logicalIndexAt(0);
        QModelIndex index = model->index(row, column, root);
        QItemSelectionModel::SelectionFlags command = q->selectionCommand(index);

        {
            // currentSelectionStartIndex gets modified inside QAbstractItemView::currentChanged()
            const auto startIndex = currentSelectionStartIndex;
            selectionModel->setCurrentIndex(index, QItemSelectionModel::NoUpdate);
            currentSelectionStartIndex = startIndex;
        }

        if ((anchor && !(command & QItemSelectionModel::Current))
            || (q->selectionMode() == QTableView::SingleSelection))
            currentSelectionStartIndex = model->index(row, column, root);

        if (q->selectionMode() != QTableView::SingleSelection
            && command.testFlag(QItemSelectionModel::Toggle)) {
            if (anchor)
                ctrlDragSelectionFlag = horizontalHeader->selectionModel()->selectedColumns(row).contains(index)
                                    ? QItemSelectionModel::Deselect : QItemSelectionModel::Select;
            command &= ~QItemSelectionModel::Toggle;
            command |= ctrlDragSelectionFlag;
            if (!anchor)
                command |= QItemSelectionModel::Current;
        }

        const auto columnSectionAnchor = currentSelectionStartIndex.column();
        QModelIndex left = model->index(row, qMin(columnSectionAnchor, column), root);
        QModelIndex right = model->index(row, qMax(columnSectionAnchor, column), root);
        if ((horizontalHeader->sectionsMoved() && left.column() != right.column())) {
            q->setSelection(q->visualRect(left) | q->visualRect(right), command | QItemSelectionModel::Columns);
        } else {
            selectionModel->select(QItemSelection(left, right), command | QItemSelectionModel::Columns);
        }
    }
}